

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O3

bool axl::sl::BitMap::isEqualImpl(size_t *p1,size_t count1,size_t *p2,size_t count2)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  
  iVar1 = bcmp(p1,p2,count1 * 8);
  if (iVar1 == 0) {
    bVar2 = true;
    if (count1 < count2) {
      do {
        bVar2 = p2[count1] == 0;
        if (!bVar2) {
          return bVar2;
        }
        bVar3 = count2 - 1 != count1;
        count1 = count1 + 1;
      } while (bVar3);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
BitMap::isEqualImpl(
	const size_t* p1,
	size_t count1,
	const size_t* p2,
 	size_t count2
) {
	ASSERT(count1 < count2);

	if (memcmp(p1, p2, count1 * sizeof(size_t)))
		return false;

	for (size_t i = count1; i < count2; i++)
		if (p2[i])
			return false;

	return true;
}